

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::collapse(QTreeViewPrivate *this,int item,bool emitSignal)

{
  QList<QTreeViewItem> *this_00;
  State SVar1;
  Data *pDVar2;
  QAbstractItemView *this_01;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  pointer pQVar6;
  QTreeViewItem *pQVar7;
  long in_FS_OFFSET;
  iterator it;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((item != -1) && (pDVar2 = (this->expandedIndexes).q_hash.d, pDVar2 != (Data *)0x0)) &&
     (pDVar2->size != 0)) {
    this_01 = *(QAbstractItemView **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    QBasicTimer::stop();
    pQVar7 = (this->viewItems).d.ptr;
    uVar3 = *(ulong *)&pQVar7[item].field_0x1c;
    pQVar7 = pQVar7 + item;
    bVar4 = QAbstractItemViewPrivate::isPersistent
                      (&this->super_QAbstractItemViewPrivate,&pQVar7->index);
    if (bVar4) {
      QPersistentModelIndex::QPersistentModelIndex(&local_40,&pQVar7->index);
      it = QHash<QPersistentModelIndex,_QHashDummyValue>::findImpl<QPersistentModelIndex>
                     (&(this->expandedIndexes).q_hash,&local_40);
      QPersistentModelIndex::~QPersistentModelIndex(&local_40);
      if ((it.i.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 ||
           it.i.bucket != 0) && (((this->viewItems).d.ptr[item].field_0x1c & 1) != 0)) {
        if ((emitSignal) && (this->animationsEnabled == true)) {
          prepareAnimatedOperation(this,item,Backward);
        }
        this_00 = &this->viewItems;
        SVar1 = (this->super_QAbstractItemViewPrivate).state;
        if (SVar1 != AnimatingState) {
          (this->super_QAbstractItemViewPrivate).stateBeforeAnimation = SVar1;
        }
        QAbstractItemView::setState(this_01,CollapsingState);
        QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                  (&(this->expandedIndexes).q_hash,(const_iterator)it.i);
        pQVar6 = QList<QTreeViewItem>::data(this_00);
        pQVar6[item].field_0x1c = pQVar6[item].field_0x1c & 0xfe;
        for (uVar5 = item; -1 < (int)uVar5; uVar5 = pQVar6[uVar5].parentItem) {
          pQVar6 = QList<QTreeViewItem>::data(this_00);
          *(ulong *)&pQVar6[uVar5].field_0x1c =
               *(ulong *)&pQVar6[uVar5].field_0x1c & 0xffffffff0000000f |
               (ulong)((int)*(ulong *)&pQVar6[uVar5].field_0x1c - ((uint)uVar3 & 0xfffffff0) &
                      0xfffffff0);
          pQVar6 = QList<QTreeViewItem>::data(this_00);
        }
        removeViewItems(this,item + 1,(uint)(uVar3 >> 4) & 0xfffffff);
        QAbstractItemView::setState
                  (this_01,(this->super_QAbstractItemViewPrivate).stateBeforeAnimation);
        if (emitSignal) {
          QTreeView::collapsed((QTreeView *)this_01,&pQVar7->index);
          if (this->animationsEnabled == true) {
            beginAnimatedOperation(this);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::collapse(int item, bool emitSignal)
{
    Q_Q(QTreeView);

    if (item == -1 || expandedIndexes.isEmpty())
        return;

    //if the current item is now invisible, the autoscroll will expand the tree to see it, so disable the autoscroll
    delayedAutoScroll.stop();

    int total = viewItems.at(item).total;
    const QModelIndex &modelIndex = viewItems.at(item).index;
    if (!isPersistent(modelIndex))
        return; // if the index is not persistent, no chances it is expanded
    QSet<QPersistentModelIndex>::iterator it = expandedIndexes.find(modelIndex);
    if (it == expandedIndexes.end() || viewItems.at(item).expanded == false)
        return; // nothing to do

#if QT_CONFIG(animation)
    if (emitSignal && animationsEnabled)
        prepareAnimatedOperation(item, QVariantAnimation::Backward);
#endif // animation

    //if already animating, stateBeforeAnimation is set to the correct value
    if (state != QAbstractItemView::AnimatingState)
        stateBeforeAnimation = state;
    q->setState(QAbstractItemView::CollapsingState);
    expandedIndexes.erase(it);
    viewItems[item].expanded = false;
    int index = item;
    while (index > -1) {
        viewItems[index].total -= total;
        index = viewItems[index].parentItem;
    }
    removeViewItems(item + 1, total); // collapse
    q->setState(stateBeforeAnimation);

    if (emitSignal) {
        emit q->collapsed(modelIndex);
#if QT_CONFIG(animation)
        if (animationsEnabled)
            beginAnimatedOperation();
#endif // animation
    }
}